

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O2

void sylvan_serialize_totext(FILE *out)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 in_RAX;
  avl_iter_t *iter;
  sylvan_ser *psVar3;
  long lVar4;
  undefined4 uVar5;
  
  fputc(0x5b,(FILE *)out);
  iter = sylvan_ser_reversed_iter(sylvan_ser_reversed_set);
  while( true ) {
    uVar5 = (undefined4)((ulong)in_RAX >> 0x20);
    psVar3 = sylvan_ser_reversed_iter_next(iter);
    if (psVar3 == (sylvan_ser *)0x0) break;
    lVar4 = (psVar3->bdd & 0xffffffffff) * 0x10;
    uVar1 = *(ulong *)(nodes->data + lVar4);
    uVar2 = *(ulong *)(nodes->data + lVar4 + 8);
    in_RAX = CONCAT44(uVar5,(uint)(uVar1 >> 0x3f));
    fprintf((FILE *)out,"(%zu,%u,%zu,%zu,%u),",psVar3->assigned,uVar2 >> 0x28,uVar2 & 0xffffffffff,
            uVar1 & 0xffffffffff,in_RAX);
  }
  free(iter);
  fputc(0x5d,(FILE *)out);
  return;
}

Assistant:

void
sylvan_serialize_totext(FILE *out)
{
    fprintf(out, "[");
    avl_iter_t *it = sylvan_ser_reversed_iter(sylvan_ser_reversed_set);
    struct sylvan_ser *s;

    while ((s=sylvan_ser_reversed_iter_next(it))) {
        BDD bdd = s->bdd;
        bddnode_t n = MTBDD_GETNODE(bdd);
        fprintf(out, "(%zu,%u,%zu,%zu,%u),", s->assigned,
                                             bddnode_getvariable(n),
                                             (size_t)bddnode_getlow(n),
                                             (size_t)BDD_STRIPMARK(bddnode_gethigh(n)),
                                             BDD_HASMARK(bddnode_gethigh(n)) ? 1 : 0);
    }

    sylvan_ser_reversed_iter_free(it);
    fprintf(out, "]");
}